

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

void __thiscall soul::HTMLGenerator::printModule(HTMLGenerator *this,HTMLElement *parent,Module *m)

{
  HTMLElement *pHVar1;
  HTMLElement *pHVar2;
  HTMLElement *pHVar3;
  char *in_R8;
  string_view classType;
  string_view className;
  string_view value;
  string_view classToUse;
  string_view text;
  string_view text_00;
  string_view classToUse_00;
  string_view text_01;
  string_view className_00;
  allocator<char> local_49;
  string local_48;
  
  className._M_str = "module";
  className._M_len = 6;
  pHVar1 = choc::html::HTMLElement::addDiv(parent,className);
  value._M_str = (m->UID)._M_dataplus._M_p;
  value._M_len = (m->UID)._M_string_length;
  pHVar1 = choc::html::HTMLElement::setID(pHVar1,value);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"h2",&local_49);
  pHVar2 = choc::html::HTMLElement::addChild(pHVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  classToUse._M_str = "module_type";
  classToUse._M_len = 0xb;
  pHVar3 = choc::html::HTMLElement::addSpan(pHVar2,classToUse);
  text._M_str = (m->moduleTypeDescription)._M_dataplus._M_p;
  text._M_len = (m->moduleTypeDescription)._M_string_length;
  pHVar3 = choc::html::HTMLElement::addContent(pHVar3,text);
  text_00._M_str = " ";
  text_00._M_len = 1;
  choc::html::HTMLElement::addContent(pHVar3,text_00);
  classToUse_00._M_str = "module_name";
  classToUse_00._M_len = 0xb;
  pHVar2 = choc::html::HTMLElement::addSpan(pHVar2,classToUse_00);
  text_01._M_str = (m->fullyQualifiedName)._M_dataplus._M_p;
  text_01._M_len = (m->fullyQualifiedName)._M_string_length;
  choc::html::HTMLElement::addContent(pHVar2,text_01);
  classType._M_str = in_R8;
  classType._M_len = (size_t)"summary";
  addComment((HTMLGenerator *)pHVar1,(HTMLElement *)&m->comment,(Comment *)0x7,classType);
  className_00._M_str = "module_sections";
  className_00._M_len = 0xf;
  pHVar1 = choc::html::HTMLElement::addDiv(pHVar1,className_00);
  printAnnotation(this,pHVar1,&m->annotation);
  printSpecialisationParams(this,pHVar1,m);
  printEndpoints(this,pHVar1,m);
  printStructs(this,pHVar1,m);
  printFunctions(this,pHVar1,m);
  printVariables(this,pHVar1,m);
  printProcessorInstances(this,pHVar1,m);
  printConnections(this,pHVar1,m);
  return;
}

Assistant:

void printModule (choc::html::HTMLElement& parent, const SourceCodeModel::Module& m)
    {
        auto& moduleDiv = parent.addDiv ("module").setID (m.UID);

        auto& title = moduleDiv.addChild ("h2");
        title.addSpan ("module_type").addContent (m.moduleTypeDescription).addContent (" ");
        title.addSpan ("module_name").addContent (m.fullyQualifiedName);

        addComment (moduleDiv, m.comment, "summary");

        auto& sections = moduleDiv.addDiv ("module_sections");
        printAnnotation (sections, m.annotation);
        printSpecialisationParams (sections, m);
        printEndpoints (sections, m);
        printStructs (sections, m);
        printFunctions (sections, m);
        printVariables (sections, m);
        printProcessorInstances (sections, m);
        printConnections (sections, m);
    }